

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O0

bool __thiscall
HPack::HuffmanDecoder::decodeStream
          (HuffmanDecoder *this,BitIStream *inputStream,QByteArray *outputBuffer)

{
  long lVar1;
  PrefixTable table_00;
  PrefixTable table_01;
  bool bVar2;
  quint64 qVar3;
  BitIStream *in_RDX;
  undefined8 in_RSI;
  vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_> *in_RDI;
  long in_FS_OFFSET;
  PrefixTableEntry PVar4;
  quint32 entryIndex;
  PrefixTable *table;
  quint32 tableIndex;
  quint32 readBits;
  PrefixTableEntry entry;
  quint32 chunk;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  HuffmanDecoder *this_00;
  reference in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  quint32 qVar5;
  undefined4 uStack_94;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined8 local_80;
  quint32 local_78;
  undefined8 local_48;
  quint32 local_40;
  undefined8 local_18;
  quint32 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = (quint32)in_RSI;
  uStack_94 = (undefined4)((ulong)in_RSI >> 0x20);
  do {
    this_00 = (HuffmanDecoder *)CONCAT44(uStack_94,qVar5);
    BitIStream::streamOffset((BitIStream *)CONCAT44(uStack_94,qVar5));
    qVar3 = BitIStream::peekBits<unsigned_int>
                      (in_RDX,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                       &in_stack_ffffffffffffff50->prefixLength);
    in_stack_ffffffffffffff5c = (uint)qVar3;
    if (in_stack_ffffffffffffff5c == 0) {
      bVar2 = BitIStream::hasMoreBits
                        ((BitIStream *)
                         CONCAT17(in_stack_ffffffffffffff37,
                                  CONCAT16(in_stack_ffffffffffffff36,
                                           CONCAT24(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30))));
      bVar2 = (bool)((bVar2 ^ 0xffU) & 1);
LAB_002a3a97:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar2;
      }
      __stack_chk_fail();
    }
    if (in_stack_ffffffffffffff5c <
        *(uint *)&in_RDI[2].
                  super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      BitIStream::skipBits
                ((BitIStream *)this_00,
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
      bVar2 = padding_is_valid(0,in_stack_ffffffffffffff5c);
      goto LAB_002a3a97;
    }
    in_stack_ffffffffffffff58 = 0;
    in_stack_ffffffffffffff50 =
         std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::operator[]
                   (in_RDI,(size_type)this_00);
    table_00.offset = qVar5;
    table_00._0_8_ = in_RDX;
    PVar4 = tableEntry(this_00,table_00,
                       CONCAT13(in_stack_ffffffffffffff37,
                                CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)));
    local_48 = PVar4._0_8_;
    local_40 = PVar4.byteValue;
    local_10 = local_40;
    local_18 = local_48;
    while (local_18._4_4_ != in_stack_ffffffffffffff58) {
      in_stack_ffffffffffffff50 =
           std::vector<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>::operator[]
                     (in_RDI,(size_type)this_00);
      in_stack_ffffffffffffff37 = (undefined1)in_stack_ffffffffffffff50->indexLength;
      table_01.offset = qVar5;
      table_01._0_8_ = in_RDX;
      PVar4 = tableEntry(this_00,table_01,
                         CONCAT13(in_stack_ffffffffffffff37,
                                  CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)));
      local_80 = PVar4._0_8_;
      local_78 = PVar4.byteValue;
      local_10 = local_78;
      in_stack_ffffffffffffff58 = local_18._4_4_;
      local_18 = local_80;
    }
    if (in_stack_ffffffffffffff5c < (uint)local_18) {
      BitIStream::skipBits
                ((BitIStream *)this_00,
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
      bVar2 = padding_is_valid(0,in_stack_ffffffffffffff5c);
      goto LAB_002a3a97;
    }
    if (((uint)local_18 == 0) || (local_10 == 0x100)) {
      BitIStream::skipBits
                ((BitIStream *)this_00,
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
      bVar2 = false;
      goto LAB_002a3a97;
    }
    QByteArray::append((char)in_RDX);
    BitIStream::skipBits
              ((BitIStream *)this_00,
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,
                                 CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
  } while( true );
}

Assistant:

bool HuffmanDecoder::decodeStream(BitIStream &inputStream, QByteArray &outputBuffer)
{
    while (true) {
        quint32 chunk = 0;
        const quint32 readBits = inputStream.peekBits(inputStream.streamOffset(), 32, &chunk);
        if (!readBits)
            return !inputStream.hasMoreBits();

        if (readBits < minCodeLength) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        quint32 tableIndex = 0;
        const PrefixTable *table = &prefixTables[tableIndex];
        quint32 entryIndex = chunk >> (32 - table->indexLength);
        PrefixTableEntry entry = tableEntry(*table, entryIndex);

        while (true) {
            if (entry.nextTable == tableIndex)
                break;

            tableIndex = entry.nextTable;
            table = &prefixTables[tableIndex];
            entryIndex = chunk << table->prefixLength >> (32 - table->indexLength);
            entry = tableEntry(*table, entryIndex);
        }

        if (entry.bitLength > readBits) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        if (!entry.bitLength || entry.byteValue == 256) {
            //EOS (256) == compression error (HPACK).
            inputStream.skipBits(readBits);
            return false;
        }

        outputBuffer.append(entry.byteValue);
        inputStream.skipBits(entry.bitLength);
    }

    return false;
}